

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O2

Real __thiscall soplex::UserTimer::stop(UserTimer *this)

{
  long lVar1;
  
  if ((this->super_Timer).status == RUNNING) {
    updateTicks(this);
    lVar1 = this->uAccount + this->uTicks;
    this->uAccount = lVar1;
    (this->super_Timer).status = STOPPED;
  }
  else {
    lVar1 = this->uAccount;
  }
  return (((double)lVar1 * 1000.0) / (double)ticks_per_sec) / 1000.0;
}

Assistant:

Real UserTimer::stop()
{
   // status remains unchanged if timer is not running
   if(status == RUNNING)
   {
      updateTicks();

      uAccount += uTicks;
      status    = STOPPED;
   }

   return ticks2sec(uAccount);
}